

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

iterator __thiscall
QList<QAction_*>::erase(QList<QAction_*> *this,const_iterator abegin,const_iterator aend)

{
  iterator iVar1;
  long lVar2;
  
  lVar2 = (long)abegin.i - (long)(this->d).ptr;
  remove(this,(char *)(lVar2 >> 3));
  iVar1 = begin(this);
  return (iterator)(iVar1.i + lVar2);
}

Assistant:

typename QList<T>::iterator QList<T>::erase(const_iterator abegin, const_iterator aend)
{
    Q_ASSERT_X(isValidIterator(abegin), "QList::erase", "The specified iterator argument 'abegin' is invalid");
    Q_ASSERT_X(isValidIterator(aend), "QList::erase", "The specified iterator argument 'aend' is invalid");
    Q_ASSERT(aend >= abegin);

    qsizetype i = std::distance(constBegin(), abegin);
    qsizetype n = std::distance(abegin, aend);
    remove(i, n);

    return begin() + i;
}